

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-string-view.cc
# Opt level: O3

void __thiscall string_view_operator_bracket_Test::TestBody(string_view_operator_bracket_Test *this)

{
  bool bVar1;
  int line;
  char *pcVar2;
  AssertionResult gtest_ar;
  Message local_38;
  internal local_30 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  AssertHelper local_20;
  
  local_38.ss_.ptr_._0_1_ = 0x77;
  testing::internal::CmpHelperEQ<char,char>(local_30,"\'w\'","sv[0]",(char *)&local_38,"words");
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message(&local_38);
    if (local_28.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_28.ptr_)->_M_dataplus)._M_p;
    }
    line = 0x97;
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_38.ss_.ptr_._0_1_ = 0x6f;
    testing::internal::CmpHelperEQ<char,char>(local_30,"\'o\'","sv[1]",(char *)&local_38,"ords");
    if (local_30[0] == (internal)0x0) {
      testing::Message::Message(&local_38);
      if (local_28.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((local_28.ptr_)->_M_dataplus)._M_p;
      }
      line = 0x98;
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_38.ss_.ptr_._0_1_ = 0x72;
      testing::internal::CmpHelperEQ<char,char>(local_30,"\'r\'","sv[2]",(char *)&local_38,"rds");
      if (local_30[0] == (internal)0x0) {
        testing::Message::Message(&local_38);
        if (local_28.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((local_28.ptr_)->_M_dataplus)._M_p;
        }
        line = 0x99;
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_38.ss_.ptr_._0_1_ = 100;
        testing::internal::CmpHelperEQ<char,char>(local_30,"\'d\'","sv[3]",(char *)&local_38,"ds");
        if (local_30[0] != (internal)0x0) {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
          local_38.ss_.ptr_._0_1_ = 0x73;
          testing::internal::CmpHelperEQ<char,char>(local_30,"\'s\'","sv[4]",(char *)&local_38,"s");
          if (local_30[0] == (internal)0x0) {
            testing::Message::Message(&local_38);
            if (local_28.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = ((local_28.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_20,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-string-view.cc"
                       ,0x9b,pcVar2);
            testing::internal::AssertHelper::operator=(&local_20,&local_38);
            testing::internal::AssertHelper::~AssertHelper(&local_20);
            if (((CONCAT71(local_38.ss_.ptr_._1_7_,local_38.ss_.ptr_._0_1_) != 0) &&
                (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
               ((long *)CONCAT71(local_38.ss_.ptr_._1_7_,local_38.ss_.ptr_._0_1_) != (long *)0x0)) {
              (**(code **)(*(long *)CONCAT71(local_38.ss_.ptr_._1_7_,local_38.ss_.ptr_._0_1_) + 8))
                        ();
            }
          }
          goto LAB_001ee1ba;
        }
        testing::Message::Message(&local_38);
        if (local_28.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((local_28.ptr_)->_M_dataplus)._M_p;
        }
        line = 0x9a;
      }
    }
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_20,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-string-view.cc"
             ,line,pcVar2);
  testing::internal::AssertHelper::operator=(&local_20,&local_38);
  testing::internal::AssertHelper::~AssertHelper(&local_20);
  if (((CONCAT71(local_38.ss_.ptr_._1_7_,local_38.ss_.ptr_._0_1_) != 0) &&
      (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
     ((long *)CONCAT71(local_38.ss_.ptr_._1_7_,local_38.ss_.ptr_._0_1_) != (long *)0x0)) {
    (**(code **)(*(long *)CONCAT71(local_38.ss_.ptr_._1_7_,local_38.ss_.ptr_._0_1_) + 8))();
  }
LAB_001ee1ba:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(string_view, operator_bracket) {
  string_view sv("words");
  ASSERT_EQ('w', sv[0]);
  ASSERT_EQ('o', sv[1]);
  ASSERT_EQ('r', sv[2]);
  ASSERT_EQ('d', sv[3]);
  ASSERT_EQ('s', sv[4]);
}